

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O3

bool __thiscall OpenMD::SelectionCompiler::lookingAtDecimal(SelectionCompiler *this,bool param_1)

{
  uint uVar1;
  uint uVar2;
  pointer pcVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  char cVar7;
  char *pcVar8;
  bool bVar9;
  
  uVar1 = this->ichToken;
  uVar2 = this->cchScript;
  if (uVar1 != uVar2) {
    pcVar3 = (this->script)._M_dataplus._M_p;
    if ((int)((pcVar3[(int)uVar1] == '-') + uVar1) < (int)uVar2) {
      uVar5 = (ulong)(pcVar3[(int)uVar1] == '-') + (long)(int)uVar1;
      cVar7 = pcVar3[uVar5];
      bVar9 = (int)cVar7 - 0x30U < 10;
      if (bVar9) {
        uVar6 = uVar5;
        do {
          uVar5 = uVar6 + 1;
          if ((long)(int)uVar2 <= (long)uVar5) {
            return false;
          }
          cVar7 = pcVar3[uVar6 + 1];
          uVar6 = uVar5;
        } while ((int)cVar7 - 0x30U < 10);
      }
      if (uVar2 == (uint)uVar5) {
        return false;
      }
      if (cVar7 != '.') {
        return false;
      }
      if (((long)uVar5 < 1) || (iVar4 = isalpha((int)pcVar3[(uVar5 & 0xffffffff) - 1]), iVar4 == 0))
      {
        uVar5 = (long)(int)(uint)uVar5 + 1;
        if (((int)uVar5 < (int)uVar2) && ((int)pcVar3[uVar5] - 0x30U < 10)) {
          pcVar8 = pcVar3 + uVar5;
          bVar9 = true;
          do {
            pcVar8 = pcVar8 + 1;
            if ((2 - uVar2) + (int)uVar5 == 1) {
              uVar5 = (ulong)uVar2;
              break;
            }
            uVar5 = (ulong)((int)uVar5 + 1);
          } while ((int)*pcVar8 - 0x30U < 10);
        }
        this->cchToken = (int)uVar5 - uVar1;
        return bVar9;
      }
    }
  }
  return false;
}

Assistant:

bool SelectionCompiler::lookingAtDecimal(bool) {
    if (ichToken == cchScript) { return false; }

    int ichT = ichToken;
    if (script[ichT] == '-') { ++ichT; }
    bool digitSeen = false;
    char ch        = 'X';
    while (ichT < cchScript && std::isdigit(ch = script[ichT])) {
      ++ichT;
      digitSeen = true;
    }

    if (ichT == cchScript || ch != '.') { return false; }

    // to support DMPC.1, let's check the character before the dot
    if (ch == '.' && (ichT > 0) && std::isalpha(script[ichT - 1])) {
      return false;
    }

    ++ichT;
    while (ichT < cchScript && std::isdigit(script[ichT])) {
      ++ichT;
      digitSeen = true;
    }
    cchToken = ichT - ichToken;
    return digitSeen;
  }